

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassEpsLin(void *arkode_mem,realtype eplifac)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKodeMem local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_38 = in_XMM0_Qa;
  local_4 = arkLs_AccessMassMem(in_XMM0_Qa,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if ((double)local_38 <= 0.0) {
      local_38 = (ARKodeMem)0x3fa999999999999a;
    }
    in_stack_ffffffffffffffd8[5] = local_38;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetMassEpsLin(void *arkode_mem, realtype eplifac)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; store input and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassEpsLin",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return(ARKLS_SUCCESS);
}